

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v7::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  bigint *in_RDI;
  bigint *unaff_retaddr;
  int quotient;
  undefined4 local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = compare((bigint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (iVar1 < 0) {
    local_1c = 0;
  }
  else {
    align(unaff_retaddr,(bigint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    local_1c = 0;
    do {
      subtract_aligned(unaff_retaddr,
                       (bigint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      local_1c = local_1c + 1;
      iVar1 = compare((bigint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                     );
    } while (-1 < iVar1);
  }
  return local_1c;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    align(divisor);
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }